

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duration.cc
# Opt level: O2

timeval absl::ToTimeval(Duration d)

{
  undefined1 auVar1 [16];
  undefined8 in_RDX;
  timespec tVar4;
  timeval tVar5;
  Duration d_00;
  long lVar2;
  long lVar3;
  
  d_00.rep_hi_ = d._8_8_;
  d_00._8_8_ = in_RDX;
  tVar4 = ToTimespec((absl *)d.rep_hi_,d_00);
  lVar3 = tVar4.tv_nsec;
  lVar2 = tVar4.tv_sec;
  if (lVar2 < 0) {
    if (lVar3 < 0x3b9ac619) {
      tVar4.tv_nsec = lVar3 + 999;
      tVar4.tv_sec = lVar2;
    }
    else {
      tVar4.tv_nsec = lVar3 + -0x3b9ac619;
      tVar4.tv_sec = lVar2 + 1;
    }
  }
  auVar1._8_8_ = 0;
  auVar1._0_8_ = tVar4.tv_nsec;
  tVar5.tv_usec._0_4_ = SUB164(auVar1 / ZEXT816(1000),0);
  tVar5.tv_sec = tVar4.tv_sec;
  tVar5.tv_usec._4_4_ = 0;
  return tVar5;
}

Assistant:

timeval ToTimeval(Duration d) {
  timeval tv;
  timespec ts = ToTimespec(d);
  if (ts.tv_sec < 0) {
    // Tweak the fields so that positive division of tv_nsec
    // maps to truncation (towards zero) for the timeval.
    ts.tv_nsec += 1000 - 1;
    if (ts.tv_nsec >= 1000 * 1000 * 1000) {
      ts.tv_sec += 1;
      ts.tv_nsec -= 1000 * 1000 * 1000;
    }
  }
  tv.tv_sec = ts.tv_sec;
  if (tv.tv_sec != ts.tv_sec) {  // narrowing
    if (ts.tv_sec < 0) {
      tv.tv_sec = std::numeric_limits<decltype(tv.tv_sec)>::min();
      tv.tv_usec = 0;
    } else {
      tv.tv_sec = std::numeric_limits<decltype(tv.tv_sec)>::max();
      tv.tv_usec = 1000 * 1000 - 1;
    }
    return tv;
  }
  tv.tv_usec = static_cast<int>(ts.tv_nsec / 1000);  // suseconds_t
  return tv;
}